

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIA.cpp
# Opt level: O3

void __thiscall
Atari2600::TIA::draw_object_visible<Atari2600::TIA::Player>
          (TIA *this,Player *object,uint8_t collision_identity,int start,int end,int time_now)

{
  ulong uVar1;
  byte *pbVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  byte bVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  
  if (start < end) {
    iVar13 = (object->super_Object<Atari2600::TIA::Player>).motion_time + -0x40;
    do {
      iVar8 = end;
      if (iVar13 < end) {
        iVar8 = iVar13;
      }
      if ((object->super_Object<Atari2600::TIA::Player>).is_moving == false) {
        iVar8 = end;
      }
      uVar14 = (object->super_Object<Atari2600::TIA::Player>).position;
      uVar4 = object->copy_flags;
      uVar10 = 0;
      if (uVar4 == 0) {
        iVar15 = 0xa0;
      }
      else if (((byte)uVar4 & (int)uVar14 < 0x10) == 0) {
        if ((int)uVar14 < 0x20) {
          if ((uVar4 & 2) == 0) {
LAB_002fb10b:
            iVar15 = 0x40;
            if ((uVar4 & 4) == 0) {
              iVar15 = 0xa0;
            }
            uVar10 = (int)(uVar4 << 0x1d) >> 0x1f & 3;
          }
          else {
            uVar10 = 2;
            iVar15 = 0x20;
          }
        }
        else {
          iVar15 = 0xa0;
          if (uVar14 < 0x40) goto LAB_002fb10b;
        }
      }
      else {
        uVar10 = 1;
        iVar15 = 0x10;
      }
      iVar7 = (iVar15 + start) - uVar14;
      iVar15 = iVar8;
      if (iVar7 < iVar8) {
        iVar15 = iVar7;
      }
      uVar14 = iVar15 - start;
      if ((object->enqueues == true) && (time_now < iVar15)) {
        uVar4 = time_now - start;
        if (uVar4 == 0 || time_now < start) {
          Player::enqueue_pixels(object,start,iVar15,start + 0x40);
        }
        else {
          uVar6 = object->pixel_position;
          iVar5 = object->adder;
          uVar9 = 0x20;
          if (((uVar6 != 0x20) && (uVar9 = uVar6, object->graphic[object->graphic_index] != '\0'))
             && (0 < (int)uVar4 && (int)uVar6 < 0x20)) {
            uVar9 = object->reverse_mask;
            lVar11 = 200;
            do {
              bVar12 = collision_identity;
              if ((object->graphic[object->graphic_index] >> ((uVar6 >> 2 ^ uVar9) & 0x1f) & 1) == 0
                 ) {
                bVar12 = 0;
              }
              pbVar2 = (byte *)((long)&(this->crt_).time_multiplier_ + lVar11 + start);
              *pbVar2 = *pbVar2 | bVar12;
              uVar6 = uVar6 + iVar5;
            } while (((int)uVar6 < 0x20) &&
                    (uVar1 = lVar11 - 199, lVar11 = lVar11 + 1, uVar1 < uVar4));
            iVar5 = object->adder;
            uVar9 = object->pixel_position;
          }
          iVar3 = object->pixel_counter;
          iVar5 = iVar5 * uVar4 + uVar9;
          if (0x1f < iVar5) {
            iVar5 = 0x20;
          }
          object->pixel_position = iVar5;
          object->pixel_counter = uVar4 + iVar3;
          if (((object->copy_index_ == 0) && (iVar3 < 4)) && (3 < (int)(uVar4 + iVar3))) {
            object->latched_pixel4_time = (start - iVar3) + 0x44;
          }
          Player::enqueue_pixels(object,time_now,iVar15,time_now + 0x40);
        }
      }
      else {
        uVar4 = object->pixel_position;
        iVar5 = object->adder;
        uVar6 = 0x20;
        if ((uVar4 != 0x20) &&
           ((uVar6 = uVar4, object->graphic[object->graphic_index] != '\0' &&
            (0 < (int)uVar14 && (int)uVar4 < 0x20)))) {
          uVar6 = object->reverse_mask;
          lVar11 = 200;
          do {
            bVar12 = collision_identity;
            if ((object->graphic[object->graphic_index] >> ((uVar4 >> 2 ^ uVar6) & 0x1f) & 1) == 0)
            {
              bVar12 = 0;
            }
            pbVar2 = (byte *)((long)&(this->crt_).time_multiplier_ + lVar11 + start);
            *pbVar2 = *pbVar2 | bVar12;
            uVar4 = uVar4 + iVar5;
          } while (((int)uVar4 < 0x20) &&
                  (uVar1 = lVar11 - 199, lVar11 = lVar11 + 1, uVar1 < uVar14));
          iVar5 = object->adder;
          uVar6 = object->pixel_position;
        }
        iVar3 = object->pixel_counter;
        iVar5 = iVar5 * uVar14 + uVar6;
        if (0x1f < iVar5) {
          iVar5 = 0x20;
        }
        object->pixel_position = iVar5;
        object->pixel_counter = iVar3 + uVar14;
        if (((object->copy_index_ == 0) && (iVar3 < 4)) && (3 < (int)(iVar3 + uVar14))) {
          object->latched_pixel4_time = (start - iVar3) + 0x44;
        }
      }
      (object->super_Object<Atari2600::TIA::Player>).position =
           (int)(uVar14 + (object->super_Object<Atari2600::TIA::Player>).position) % 0xa0;
      if (((object->super_Object<Atari2600::TIA::Player>).is_moving == true) && (iVar15 == iVar13))
      {
        perform_motion_step<Atari2600::TIA::Player>(this,object);
        iVar13 = iVar13 + 4;
      }
      else if (iVar7 <= iVar8) {
        object->pixel_position = 0;
        object->pixel_counter = 0;
        object->copy_index_ = uVar10;
      }
      start = iVar15;
    } while (iVar15 < end);
  }
  return;
}

Assistant:

void TIA::draw_object_visible(T &object, const uint8_t collision_identity, int start, int end, int time_now) {
	// perform a miniature event loop on (i) triggering draws; (ii) drawing; and (iii) motion
	int next_motion_time = object.motion_time - first_pixel_cycle + 4;
	while(start < end) {
		int next_event_time = end;

		// is the next event a movement tick?
		if(object.is_moving && next_motion_time < next_event_time) {
			next_event_time = next_motion_time;
		}

		// is the next event a graphics trigger?
		int next_copy = 160;
		int next_copy_id = 0;
		if(object.copy_flags) {
			if(object.position < 16 && object.copy_flags&1) {
				next_copy = 16;
				next_copy_id = 1;
			} else if(object.position < 32 && object.copy_flags&2) {
				next_copy = 32;
				next_copy_id = 2;
			} else if(object.position < 64 && object.copy_flags&4) {
				next_copy = 64;
				next_copy_id = 3;
			}
		}

		int next_copy_time = start + next_copy - object.position;
		if(next_copy_time < next_event_time) next_event_time = next_copy_time;

		// the decision is to progress by length
		const int length = next_event_time - start;

		// enqueue a future intention to draw pixels if spitting them out now would violate accuracy;
		// otherwise draw them now
		if(object.enqueues && next_event_time > time_now) {
			if(start < time_now) {
				object.output_pixels(&collision_buffer_[start], time_now - start, collision_identity, start + first_pixel_cycle - 4);
				object.enqueue_pixels(time_now, next_event_time, time_now + first_pixel_cycle - 4);
			} else {
				object.enqueue_pixels(start, next_event_time, start + first_pixel_cycle - 4);
			}
		} else {
			object.output_pixels(&collision_buffer_[start], length, collision_identity, start + first_pixel_cycle - 4);
		}

		// the next interesting event is after next_event_time cycles, so progress
		object.position = (object.position + length) % 160;
		start = next_event_time;

		// if the event is a motion tick, apply; if it's a draw trigger, trigger a draw
		if(object.is_moving && start == next_motion_time) {
			perform_motion_step(object);
			next_motion_time += 4;
		} else if(start == next_copy_time) {
			object.reset_pixels(next_copy_id);
		}
	}
}